

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDXT.cpp
# Opt level: O2

void __thiscall nv::BlockCTX1::evaluatePalette(BlockCTX1 *this,Color32 *color_array)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  
  (color_array->field_0).field_0.b = '\0';
  bVar1 = this->col0[1];
  (color_array->field_0).field_0.g = bVar1;
  (color_array->field_0).field_0.r = this->col0[0];
  (color_array->field_0).field_0.a = 0xff;
  color_array[1].field_0.field_0.r = '\0';
  bVar2 = this->col0[1];
  color_array[1].field_0.field_0.g = bVar2;
  bVar3 = this->col1[0];
  color_array[1].field_0.field_0.b = bVar3;
  color_array[1].field_0.field_0.a = 0xff;
  *(undefined2 *)((long)&color_array[2].field_0 + 2) = 0xff00;
  color_array[2].field_0.field_0.g = (uint8)(((uint)bVar2 + (uint)bVar1 * 2) / 3);
  color_array[2].field_0.field_0.b = bVar3 / 3;
  *(undefined2 *)((long)&color_array[3].field_0 + 2) = 0xff00;
  color_array[3].field_0.field_0.g = (uint8)(((uint)bVar1 + (uint)bVar2 * 2) / 3);
  color_array[3].field_0.field_0.b = (uint8)(((uint)bVar3 * 2) / 3);
  return;
}

Assistant:

void BlockCTX1::evaluatePalette(Color32 color_array[4]) const
{
	// Does bit expansion before interpolation.
	color_array[0].b = 0x00;
	color_array[0].g = col0[1];
	color_array[0].r = col0[0];
	color_array[0].a = 0xFF;
	
	color_array[1].r = 0x00;
	color_array[1].g = col0[1];
	color_array[1].b = col1[0];
	color_array[1].a = 0xFF;
	
	color_array[2].r = 0x00;
	color_array[2].g = (2 * color_array[0].g + color_array[1].g) / 3;
	color_array[2].b = (2 * color_array[0].b + color_array[1].b) / 3;
	color_array[2].a = 0xFF;
		
	color_array[3].r = 0x00;
	color_array[3].g = (2 * color_array[1].g + color_array[0].g) / 3;
	color_array[3].b = (2 * color_array[1].b + color_array[0].b) / 3;
	color_array[3].a = 0xFF;
}